

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDataCacheWrapper.cpp
# Opt level: O3

HRESULT __thiscall
Js::SimpleDataCacheWrapper::SeekReadStreamToBlock
          (SimpleDataCacheWrapper *this,BlockType blockType,ULONG *bytesInBlock)

{
  HRESULT HVar1;
  
  if (bytesInBlock != (ULONG *)0x0) {
    *bytesInBlock = 0;
  }
  HVar1 = -0x7fffbffb;
  if ((this->inStream).ptr == (IStream *)0x0) {
    HVar1 = ReadHeader(this);
    if (-1 < HVar1) {
      HVar1 = SeekReadStreamToBlockHelper(this,blockType,bytesInBlock);
      return HVar1;
    }
  }
  return HVar1;
}

Assistant:

HRESULT SimpleDataCacheWrapper::SeekReadStreamToBlock(_In_ BlockType blockType, _Out_opt_ ULONG* bytesInBlock)
    {
        HRESULT hr;

        if (bytesInBlock != nullptr)
        {
            *bytesInBlock = 0;
        }

        IFFAILRET(ResetReadStream());

        // Reset above has moved the seek pointer to just after the header, we're at the first block.
        return SeekReadStreamToBlockHelper(blockType, bytesInBlock);
    }